

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O3

void __thiscall
charls::jls_codec<charls::lossless_traits<unsigned_short,_12>,_charls::encoder_strategy>::do_line
          (jls_codec<charls::lossless_traits<unsigned_short,_12>,_charls::encoder_strategy> *this,
          sample_type *param_1)

{
  ushort uVar1;
  ushort uVar2;
  sample_type sVar3;
  int32_t iVar4;
  int32_t iVar5;
  int32_t iVar6;
  uint uVar7;
  uint uVar8;
  int qs;
  uint uVar9;
  uint index;
  uint uVar10;
  
  if (this->width_ != 0) {
    uVar7 = (uint)*this->previous_line_;
    uVar8 = (uint)this->previous_line_[-1];
    index = 0;
    do {
      uVar1 = this->current_line_[(long)(int)index + -1];
      uVar2 = this->previous_line_[(long)(int)index + 1];
      iVar4 = quantize_gradient(this,uVar2 - uVar7);
      uVar10 = uVar7 - uVar8;
      iVar5 = quantize_gradient(this,uVar10);
      uVar9 = (uint)uVar1;
      iVar6 = quantize_gradient(this,uVar8 - uVar9);
      qs = (iVar4 * 9 + iVar5) * 9 + iVar6;
      if (qs == 0) {
        iVar4 = do_run_mode(this,index,(encoder_strategy *)0x0);
        index = index + iVar4;
        uVar8 = (uint)this->previous_line_[(long)(int)index + -1];
        uVar7 = (uint)this->previous_line_[(int)index];
      }
      else {
        if ((int)(uVar10 ^ -(uint)(uVar7 < uVar9)) < 0) {
          uVar10 = 0;
        }
        uVar10 = uVar10 + uVar9;
        if ((int)(uVar8 - uVar9 ^ -(uint)(uVar7 < uVar9)) < 0) {
          uVar10 = uVar7;
        }
        sVar3 = do_regular(this,qs,(uint)this->current_line_[(int)index],uVar10,
                           (encoder_strategy *)0x0);
        this->current_line_[(int)index] = sVar3;
        index = index + 1;
        uVar8 = uVar7;
        uVar7 = (uint)uVar2;
      }
    } while (index < this->width_);
  }
  return;
}

Assistant:

FORCE_INLINE void do_line(sample_type* /*template_selector*/)
    {
        int32_t index{};
        int32_t rb{previous_line_[index - 1]};
        int32_t rd{previous_line_[index]};

        while (static_cast<uint32_t>(index) < width_)
        {
            const int32_t ra{current_line_[index - 1]};
            const int32_t rc{rb};
            rb = rd;
            rd = previous_line_[index + 1];

            const int32_t qs{
                compute_context_id(quantize_gradient(rd - rb), quantize_gradient(rb - rc), quantize_gradient(rc - ra))};

            if (qs != 0)
            {
                current_line_[index] =
                    do_regular(qs, current_line_[index], get_predicted_value(ra, rb, rc), static_cast<Strategy*>(nullptr));
                ++index;
            }
            else
            {
                index += do_run_mode(index, static_cast<Strategy*>(nullptr));
                rb = previous_line_[index - 1];
                rd = previous_line_[index];
            }
        }
    }